

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleTypeHandler<2UL>::SetAllPropertiesToUndefined
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,bool invalidateFixedFields)

{
  RecyclableObject *value;
  int index;
  
  if (0 < this->propertyCount) {
    value = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
    index = 0;
    do {
      DynamicTypeHandler::SetSlotUnchecked(instance,index,value);
      index = index + 1;
    } while (index < this->propertyCount);
  }
  return;
}

Assistant:

void SimpleTypeHandler<size>::SetAllPropertiesToUndefined(DynamicObject* instance, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.

        // We can ignore invalidateFixedFields, because SimpleTypeHandler doesn't support fixed fields at this point.
        Js::RecyclableObject* undefined = instance->GetLibrary()->GetUndefined();
        for (int propertyIndex = 0; propertyIndex < this->propertyCount; propertyIndex++)
        {
            SetSlotUnchecked(instance, propertyIndex, undefined);
        }
    }